

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitAtomicNotify
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          AtomicNotify *curr)

{
  undefined1 this_00 [8];
  Address memorySize;
  Literal *pLVar1;
  Address addr;
  undefined1 local_100 [8];
  Flow ptr;
  Flow count;
  Literal local_58;
  undefined1 local_40 [8];
  MemoryInstanceInfo info;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_100,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->ptr);
  if (ptr.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&ptr.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->notifyCount);
    if (count.breakTo.super_IString.str._M_len == 0) {
      getMemoryInstanceInfo
                ((MemoryInstanceInfo *)local_40,this,(Name)(curr->memory).super_IString.str);
      memorySize = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_40,(Name)info._0_16_)
      ;
      this_00 = local_40;
      pLVar1 = Flow::getSingleValue((Flow *)local_100);
      ::wasm::Literal::Literal(&local_58,pLVar1);
      addr = getFinalAddress<wasm::AtomicNotify>
                       ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00,curr,&local_58,4,memorySize)
      ;
      ::wasm::Literal::~Literal(&local_58);
      checkAtomicAddress((ModuleRunnerBase<wasm::ModuleRunner> *)local_40,addr,4,memorySize);
      count.breakTo.super_IString.str._M_str._0_4_ = 0;
      Flow::Flow(__return_storage_ptr__,(Literal *)&count.breakTo.super_IString.str._M_str);
      ::wasm::Literal::~Literal((Literal *)&count.breakTo.super_IString.str._M_str);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&ptr.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&ptr.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_100);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_100);
  return __return_storage_ptr__;
}

Assistant:

Flow visitAtomicNotify(AtomicNotify* curr) {
    NOTE_ENTER("AtomicNotify");
    Flow ptr = self()->visit(curr->ptr);
    if (ptr.breaking()) {
      return ptr;
    }
    NOTE_EVAL1(ptr);
    auto count = self()->visit(curr->notifyCount);
    NOTE_EVAL1(count);
    if (count.breaking()) {
      return count;
    }
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    auto addr =
      info.instance->getFinalAddress(curr, ptr.getSingleValue(), 4, memorySize);
    // Just check TODO actual threads support
    info.instance->checkAtomicAddress(addr, 4, memorySize);
    return Literal(int32_t(0)); // none woken up
  }